

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsslcipher.cpp
# Opt level: O0

void __thiscall QSslCipher::QSslCipher(QSslCipher *this,QSslCipher *other)

{
  pointer __p;
  QSslCipherPrivate *in_RDI;
  
  __p = (pointer)operator_new(0x98);
  QSslCipherPrivate::QSslCipherPrivate(in_RDI);
  std::unique_ptr<QSslCipherPrivate,std::default_delete<QSslCipherPrivate>>::
  unique_ptr<std::default_delete<QSslCipherPrivate>,void>
            ((unique_ptr<QSslCipherPrivate,_std::default_delete<QSslCipherPrivate>_> *)in_RDI,__p);
  std::unique_ptr<QSslCipherPrivate,_std::default_delete<QSslCipherPrivate>_>::get
            ((unique_ptr<QSslCipherPrivate,_std::default_delete<QSslCipherPrivate>_> *)0x38bdba);
  std::unique_ptr<QSslCipherPrivate,_std::default_delete<QSslCipherPrivate>_>::get
            ((unique_ptr<QSslCipherPrivate,_std::default_delete<QSslCipherPrivate>_> *)0x38bdc9);
  QSslCipherPrivate::operator=(in_RDI,__p);
  return;
}

Assistant:

QSslCipher::QSslCipher(const QSslCipher &other)
    : d(new QSslCipherPrivate)
{
    *d.get() = *other.d.get();
}